

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::BinaryExpression<const_int_&,_(Catch::Internal::Operator)0,_const_int_&>::endExpression
          (BinaryExpression<const_int_&,_(Catch::Internal::Operator)0,_const_int_&> *this)

{
  bool result;
  ResultBuilder *pRVar1;
  BinaryExpression<const_int_&,_(Catch::Internal::Operator)0,_const_int_&> *this_local;
  
  pRVar1 = this->m_rb;
  result = Internal::compare<(Catch::Internal::Operator)0,int,int>(this->m_lhs,this->m_rhs);
  pRVar1 = ResultBuilder::setResultType(pRVar1,result);
  ResultBuilder::endExpression(pRVar1,&this->super_DecomposedExpression);
  return;
}

Assistant:

void endExpression() const {
        m_rb
            .setResultType( Internal::compare<Op>( m_lhs, m_rhs ) )
            .endExpression( *this );
    }